

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySerializer.cpp
# Opt level: O0

string * __thiscall
ser::BinarySerializer::WriteArray_abi_cxx11_
          (string *__return_storage_ptr__,BinarySerializer *this,void *data,int bytesPerElement,
          int isize,int jsize,int ksize,int lsize,int istride,int jstride,int kstride,int lstride,
          vector<char,_std::allocator<char>_> *binaryData)

{
  char *data_00;
  size_type sVar1;
  char *pIn;
  int i;
  int j;
  int k;
  int l;
  char *pVec;
  int dataSize;
  char *pData;
  int jsize_local;
  int isize_local;
  int bytesPerElement_local;
  void *data_local;
  BinarySerializer *this_local;
  
  std::vector<char,_std::allocator<char>_>::resize
            (binaryData,(long)(bytesPerElement * isize * jsize * ksize * lsize));
  _k = std::vector<char,_std::allocator<char>_>::data(binaryData);
  for (j = 0; j < lsize; j = j + 1) {
    for (i = 0; i < ksize; i = i + 1) {
      for (pIn._4_4_ = 0; pIn._4_4_ < jsize; pIn._4_4_ = pIn._4_4_ + 1) {
        for (pIn._0_4_ = 0; (int)pIn < isize; pIn._0_4_ = (int)pIn + 1) {
          memcpy(_k,(void *)((long)data +
                            (long)((int)pIn * istride + pIn._4_4_ * jstride + i * kstride +
                                  j * lstride)),(long)bytesPerElement);
          _k = _k + bytesPerElement;
        }
      }
    }
  }
  data_00 = std::vector<char,_std::allocator<char>_>::data(binaryData);
  sVar1 = std::vector<char,_std::allocator<char>_>::size(binaryData);
  computeChecksum_abi_cxx11_(__return_storage_ptr__,data_00,(int)sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BinarySerializer::WriteArray(const void* data, int bytesPerElement,
        int isize, int jsize, int ksize, int lsize,
        int istride, int jstride, int kstride, int lstride,
        std::vector<char>& binaryData) const
{
    const char* pData = reinterpret_cast<const char*>(data);

    // Compute data size and reserve memory
    const int dataSize = bytesPerElement * (isize*jsize*ksize*lsize);
    binaryData.resize(dataSize);
    char* pVec = binaryData.data();

    // Write data in column-major (fortran) ordering
    for (int l = 0; l < lsize; ++l)
        for (int k = 0; k < ksize; ++k)
            for (int j = 0; j < jsize; ++j)
                for (int i = 0; i < isize; ++i)
                {
                    const char* pIn = pData + (i*istride + j*jstride + k*kstride + l*lstride);
                    std::memcpy(pVec, pIn, bytesPerElement);
                    pVec += bytesPerElement;
                }

    // Compute checksum
    return computeChecksum(binaryData.data(), binaryData.size());
}